

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_mimetype_clear(void)

{
  fio_mime_set_free(&fio_http_mime_types);
  fiobj_free(current_date);
  current_date = 0;
  last_date_added = 0;
  return;
}

Assistant:

void http_mimetype_clear(void) {
  fio_mime_set_free(&fio_http_mime_types);
  fiobj_free(current_date);
  current_date = FIOBJ_INVALID;
  last_date_added = 0;
}